

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable.cpp
# Opt level: O2

void copy_test(void)

{
  test_struct *ptVar1;
  size_t sVar2;
  undefined8 extraout_RAX;
  int line;
  char *expr;
  trackable<test_struct> local_58;
  trackable<test_struct> local_48;
  trackable_ptr_base local_38;
  trackable_ptr_base local_20;
  
  local_38.obj = &local_58.super_trackable_base;
  local_20.obj = &local_48.super_trackable_base;
  local_48.value.i = 1;
  local_58.value.i = 2;
  local_48.super_trackable_base.first_ptr = &local_20;
  local_20.next = (trackable_ptr_base *)0x0;
  local_20.prev = (trackable_ptr_base *)0x0;
  local_58.super_trackable_base.first_ptr = &local_38;
  local_38.next = (trackable_ptr_base *)0x0;
  local_38.prev = (trackable_ptr_base *)0x0;
  ptVar1 = tower120::trackable_ptr<test_struct>::operator->
                     ((trackable_ptr<test_struct> *)local_48.super_trackable_base.first_ptr);
  if (ptVar1->i == 1) {
    ptVar1 = tower120::trackable_ptr<test_struct>::operator->
                       ((trackable_ptr<test_struct> *)&local_38);
    expr = "p2->i == 2";
    if (ptVar1->i == 2) {
      local_48.value.i = local_58.value.i;
      ptVar1 = tower120::trackable_ptr<test_struct>::operator->
                         ((trackable_ptr<test_struct> *)&local_20);
      if (ptVar1->i == 2) {
        ptVar1 = tower120::trackable_ptr<test_struct>::operator->
                           ((trackable_ptr<test_struct> *)&local_38);
        if (ptVar1->i == 2) {
          if (local_20.obj == local_38.obj) {
            line = 0x29;
            expr = "p1 != p2";
          }
          else {
            sVar2 = tower120::ptrs_count(&local_48.super_trackable_base);
            if (sVar2 == 1) {
              sVar2 = tower120::ptrs_count(&local_58.super_trackable_base);
              if (sVar2 == 1) {
                tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_38);
                tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_20);
                tower120::trackable<test_struct>::~trackable(&local_58);
                tower120::trackable<test_struct>::~trackable(&local_48);
                return;
              }
              line = 0x2c;
              expr = "ptrs_count(d2) == 1";
            }
            else {
              line = 0x2b;
              expr = "ptrs_count(d1) == 1";
            }
          }
        }
        else {
          line = 0x27;
        }
      }
      else {
        line = 0x26;
        expr = "p1->i == 2";
      }
    }
    else {
      line = 0x24;
    }
  }
  else {
    line = 0x23;
    expr = "p1->i == 1";
  }
  detail::require_failed
            (expr,
             "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable.cpp"
             ,line);
  tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_38);
  tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_20);
  tower120::trackable<test_struct>::~trackable(&local_58);
  tower120::trackable<test_struct>::~trackable(&local_48);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void copy_test(){
    trackable<test_struct> d1{{1}};
    trackable<test_struct> d2{{2}};

    trackable_ptr<test_struct> p1 {&d1};
    trackable_ptr<test_struct> p2 {&d2};
    REQUIRE(p1->i == 1);
    REQUIRE(p2->i == 2);
    d1 = d2;
    REQUIRE(p1->i == 2);
    REQUIRE(p2->i == 2);

    REQUIRE(p1 != p2);

    REQUIRE(ptrs_count(d1) == 1);
    REQUIRE(ptrs_count(d2) == 1);
}